

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O0

void Fl_Input_Choice::inp_cb(Fl_Widget *param_1,void *data)

{
  uint uVar1;
  Fl_When FVar2;
  int iVar3;
  Fl_Callback_p pFVar4;
  Fl_Widget_Tracker local_28;
  Fl_Widget_Tracker wp;
  Fl_Input_Choice *o;
  void *data_local;
  Fl_Widget *param_0_local;
  
  wp.wp_ = (Fl_Widget *)data;
  Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,(Fl_Widget *)data);
  uVar1 = Fl_Widget::changed(*(Fl_Widget **)&wp.wp_[1].w_);
  if (uVar1 == 0) {
    Fl_Widget::clear_changed(wp.wp_);
    FVar2 = Fl_Widget::when(wp.wp_);
    if ((FVar2 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER) {
      Fl_Widget::do_callback(wp.wp_);
    }
  }
  else {
    Fl_Widget::set_changed(wp.wp_);
    FVar2 = Fl_Widget::when(wp.wp_);
    if ((FVar2 & (FL_WHEN_RELEASE|FL_WHEN_CHANGED)) != FL_WHEN_NEVER) {
      Fl_Widget::do_callback(wp.wp_);
    }
  }
  iVar3 = Fl_Widget_Tracker::deleted(&local_28);
  if ((iVar3 == 0) && (pFVar4 = Fl_Widget::callback(wp.wp_), pFVar4 != Fl_Widget::default_callback))
  {
    Fl_Widget::clear_changed(wp.wp_);
  }
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
  return;
}

Assistant:

static void inp_cb(Fl_Widget*, void *data) { 
    Fl_Input_Choice *o=(Fl_Input_Choice *)data;
    Fl_Widget_Tracker wp(o);
    if (o->inp_->changed()) {
      o->Fl_Widget::set_changed();
      if (o->when() & (FL_WHEN_CHANGED|FL_WHEN_RELEASE))
	o->do_callback();
    } else {
      o->Fl_Widget::clear_changed();
      if (o->when() & FL_WHEN_NOT_CHANGED)
	o->do_callback();
    }
    
    if (wp.deleted()) return;

    if (o->callback() != default_callback)
      o->Fl_Widget::clear_changed();
  }